

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O3

bool __thiscall BamTools::Internal::HostAddress::ParseAddress(HostAddress *this)

{
  pointer pcVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  string *address;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  string tmp;
  uint8_t maybeIp6 [16];
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  string local_c8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  string local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  undefined2 *local_58;
  undefined8 local_50;
  undefined2 local_48;
  undefined1 local_46;
  long local_38;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (this->m_ipString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (this->m_ipString)._M_string_length);
  lVar4 = std::__cxx11::string::find((char)&local_90,0x3a);
  if (lVar4 != -1) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    lVar4 = std::__cxx11::string::rfind((char)&local_c8,0x25);
    if (lVar4 != -1) {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_c8);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58);
      }
    }
    Split(&local_70,&local_c8,':');
    uVar8 = (uint)((int)local_70.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (int)local_70.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xff;
    if (uVar8 - 9 < 0xfffffffa) {
LAB_001a6167:
      bVar3 = false;
    }
    else {
      local_48 = 0x3a3a;
      local_50 = 2;
      local_46 = 0;
      bVar7 = 0;
      local_58 = &local_48;
      lVar4 = std::__cxx11::string::find((char *)&local_c8,(ulong)&local_48,0);
      if (lVar4 != -1) {
        bVar7 = 0;
        do {
          bVar7 = bVar7 + 1;
          lVar4 = std::__cxx11::string::find((char *)&local_c8,(ulong)local_58,lVar4 + 1);
        } while (lVar4 != -1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58);
      }
      if (uVar8 == 8 && 1 < bVar7) goto LAB_001a6167;
      lVar4 = std::__cxx11::string::find((char)&local_c8,0x2e);
      if (bVar7 != 1) {
        if ((lVar4 == -1) + 7 <= uVar8) goto LAB_001a6251;
        goto LAB_001a6167;
      }
      if (uVar8 == 0) {
LAB_001a6234:
        bVar3 = true;
      }
      else {
LAB_001a6251:
        local_98 = (ulong)(uVar8 - 1);
        uVar6 = (ulong)(9 - uVar8);
        uVar10 = (ulong)(char)(uVar8 - 1);
        uVar9 = (ulong)(uVar8 - 2);
        lVar4 = 0x10;
        local_38 = uVar9 << 5;
        do {
          lVar2 = CONCAT44(local_70.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (int)local_70.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          uVar5 = CONCAT44(local_70.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           (int)local_70.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish) - lVar2 >> 5;
          if (uVar5 <= uVar10) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar10);
          }
          if (*(long *)(lVar2 + 8 + uVar10 * 0x20) == 0) {
            if ((int)local_98 == (int)uVar10) {
              if (uVar5 <= uVar9) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar9);
              }
              if (*(long *)(lVar2 + 8 + local_38) != 0) {
                *(undefined2 *)((long)&local_c8.field_2 + lVar4 + 0xe) = 0;
                goto LAB_001a6330;
              }
              goto LAB_001a6167;
            }
            if (uVar10 == 0) {
              if (uVar5 < 2) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,1);
              }
              if (*(long *)(lVar2 + 0x28) == 0) goto LAB_001a6167;
              *(undefined2 *)((long)&local_c8.field_2 + lVar4 + 0xe) = 0;
              goto LAB_001a6234;
            }
            if (uVar6 == 0) {
              uVar6 = 0;
            }
            else {
              bVar7 = 1;
              do {
                if (lVar4 == 0) goto LAB_001a6167;
                *(undefined2 *)((long)&local_c8.field_2 + lVar4 + 0xe) = 0;
                lVar4 = lVar4 + -2;
                uVar5 = (ulong)bVar7;
                bVar7 = bVar7 + 1;
              } while (uVar5 < uVar6);
            }
          }
          else {
            address = (string *)(lVar2 + uVar10 * 0x20);
            uVar5 = strtoul((address->_M_dataplus)._M_p,(char **)0x0,0x10);
            if ((short)(uVar5 >> 0x10) == 0) {
              *(ushort *)((long)&local_c8.field_2 + lVar4 + 0xe) =
                   (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
LAB_001a6330:
              lVar4 = lVar4 + -2;
            }
            else {
              if (((int)local_98 != (int)uVar10) ||
                 (bVar3 = ParseIp4(address,(uint32_t *)&local_58), !bVar3)) goto LAB_001a6167;
              *(uint *)((long)&local_c8.field_2 + lVar4 + 0xc) =
                   (uint)local_58 >> 0x18 | ((uint)local_58 & 0xff0000) >> 8 |
                   ((uint)local_58 & 0xff00) << 8 | (uint)local_58 << 0x18;
              lVar4 = lVar4 + -4;
              uVar6 = uVar6 - 1;
            }
          }
          bVar3 = (long)uVar10 < 1;
        } while ((0 < (long)uVar10) && (uVar10 = uVar10 - 1, lVar4 != 0));
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if (bVar3) {
      *(undefined8 *)(this->m_ip6Address).data = local_a8;
      *(undefined8 *)((this->m_ip6Address).data + 8) = uStack_a0;
      this->m_hasIpAddress = true;
      this->m_protocol = IPv6Protocol;
      bVar3 = true;
      goto LAB_001a61f7;
    }
  }
  lVar4 = std::__cxx11::string::find((char)&local_90,0x2e);
  if (lVar4 != -1) {
    local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffff00000000;
    bVar3 = ParseIp4(&local_90,(uint32_t *)&local_c8);
    if (bVar3) {
      this->m_ip4Address = (uint32_t)local_c8._M_dataplus._M_p;
      this->m_hasIpAddress = true;
      this->m_protocol = IPv4Protocol;
      bVar3 = true;
      goto LAB_001a61f7;
    }
  }
  this->m_protocol = UnknownNetworkProtocol;
  bVar3 = false;
LAB_001a61f7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool HostAddress::ParseAddress()
{

    // all IPv6 addresses should have a ':'
    std::string s = m_ipString;
    std::size_t found = s.find(':');
    if (found != std::string::npos) {
        // try parse IP6 address
        uint8_t maybeIp6[16];
        if (ParseIp6(s, maybeIp6)) {
            SetAddress(maybeIp6);
            m_protocol = HostAddress::IPv6Protocol;
            return true;
        }
    }

    // all IPv4 addresses should have a '.'
    found = s.find('.');
    if (found != std::string::npos) {
        uint32_t maybeIp4(0);
        if (ParseIp4(s, maybeIp4)) {
            SetAddress(maybeIp4);
            m_protocol = HostAddress::IPv4Protocol;
            return true;
        }
    }

    // else likely just a plain-text host name "www.foo.bar"
    // will need to look up IP address info later
    m_protocol = HostAddress::UnknownNetworkProtocol;
    return false;
}